

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ScalarFunction * duckdb::ExpFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  FunctionNullHandling in_stack_ffffffffffffff58;
  bind_lambda_function_t in_stack_ffffffffffffff60;
  scalar_function_t local_98;
  LogicalType local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,DOUBLE);
  __l._M_len = 1;
  __l._M_array = &local_30;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,(allocator_type *)&stack0xffffffffffffff67);
  LogicalType::LogicalType(&local_78,DOUBLE);
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<double,double,duckdb::ExpOperator>;
  local_98._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_48,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_48;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff44;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff4c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_60,&local_78,&local_98,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
  LogicalType::~LogicalType(&local_48);
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  LogicalType::~LogicalType(&local_30);
  return in_RDI;
}

Assistant:

ScalarFunction ExpFun::GetFunction() {
	return ScalarFunction({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                      ScalarFunction::UnaryFunction<double, double, ExpOperator>);
}